

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpscheduler.cpp
# Opt level: O1

bool __thiscall jrtplib::RTCPScheduler::IsTime(RTCPScheduler *this)

{
  RTPInternalSourceData *pRVar1;
  bool bVar2;
  double dVar3;
  RTPTime RVar4;
  double extraout_XMM0_Qa;
  double dVar5;
  timespec tpSys;
  timespec tpMono;
  timespec local_40;
  timespec local_30;
  
  if (this->firstcall == true) {
    this->firstcall = false;
    if (RTPTime::CurrentTime()::s_initialized == '\0') {
      RTPTime::CurrentTime()::s_initialized = '\x01';
      clock_gettime(0,&local_40);
      clock_gettime(1,&local_30);
      dVar3 = (double)local_40.tv_nsec * 1e-09 + (double)local_40.tv_sec;
      RTPTime::CurrentTime()::s_startOffet =
           dVar3 - ((double)local_30.tv_nsec * 1e-09 + (double)local_30.tv_sec);
    }
    else {
      clock_gettime(1,&local_40);
      dVar3 = (double)local_40.tv_nsec * 1e-09 + (double)local_40.tv_sec +
              RTPTime::CurrentTime()::s_startOffet;
    }
    (this->prevrtcptime).m_t = dVar3;
    this->pmembers = this->sources->activecount;
    CalculateNextRTCPTime(this);
  }
  else {
    if (RTPTime::CurrentTime()::s_initialized == '\0') {
      RTPTime::CurrentTime()::s_initialized = '\x01';
      clock_gettime(0,&local_40);
      clock_gettime(1,&local_30);
      dVar3 = (double)local_40.tv_nsec * 1e-09 + (double)local_40.tv_sec;
      RTPTime::CurrentTime()::s_startOffet =
           dVar3 - ((double)local_30.tv_nsec * 1e-09 + (double)local_30.tv_sec);
    }
    else {
      clock_gettime(1,&local_40);
      dVar3 = (double)local_40.tv_nsec * 1e-09 + (double)local_40.tv_sec +
              RTPTime::CurrentTime()::s_startOffet;
    }
    if ((this->nextrtcptime).m_t <= dVar3) {
      if (this->byescheduled == false) {
        pRVar1 = this->sources->owndata;
        if (pRVar1 == (RTPInternalSourceData *)0x0) {
          bVar2 = false;
        }
        else {
          bVar2 = (pRVar1->super_RTPSourceData).issender;
        }
        RVar4 = CalculateDeterministicInterval(this,bVar2);
        (*this->rtprand->_vptr_RTPRandom[5])();
        RVar4.m_t = ((extraout_XMM0_Qa + 0.5) * RVar4.m_t) / 1.21828;
      }
      else {
        RVar4 = CalculateBYETransmissionInterval(this);
      }
      dVar5 = RVar4.m_t + (this->prevrtcptime).m_t;
      bVar2 = dVar5 <= dVar3;
      if (bVar2) {
        this->byescheduled = false;
        (this->prevrtcptime).m_t = dVar3;
        this->pmembers = this->sources->activecount;
        CalculateNextRTCPTime(this);
        return bVar2;
      }
      (this->nextrtcptime).m_t = dVar5;
      this->pmembers = this->sources->activecount;
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool RTCPScheduler::IsTime()
{
	if (firstcall)
	{
		firstcall = false;
		prevrtcptime = RTPTime::CurrentTime();
		pmembers = sources.GetActiveMemberCount();
		CalculateNextRTCPTime();
		return false;
	}

	RTPTime currenttime = RTPTime::CurrentTime();

//	// TODO: for debugging
//	double diff = nextrtcptime.GetDouble() - currenttime.GetDouble();
//
//	std::cout << "Delay till next RTCP interval: " << diff << std::endl;
	
	if (currenttime < nextrtcptime) // timer has not yet expired
		return false;

	RTPTime checktime(0,0);
	
	if (!byescheduled)
	{
		bool aresender = false;
		RTPSourceData *srcdat;
		
		if ((srcdat = sources.GetOwnSourceInfo()) != 0)
			aresender = srcdat->IsSender();
		
		checktime = CalculateTransmissionInterval(aresender);
	}
	else
		checktime = CalculateBYETransmissionInterval();
	
//	std::cout << "Calculated checktime: " << checktime.GetDouble() << std::endl;
	
	checktime += prevrtcptime;
	
	if (checktime <= currenttime) // Okay
	{
		byescheduled = false;
		prevrtcptime = currenttime;
		pmembers = sources.GetActiveMemberCount();
		CalculateNextRTCPTime();
		return true;
	}

//	std::cout << "New delay: " << nextrtcptime.GetDouble() - currenttime.GetDouble() << std::endl;
	
	nextrtcptime = checktime;
	pmembers = sources.GetActiveMemberCount();
	
	return false;
}